

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

Image * Image_Function::ConvertTo8Bit(Image *__return_storage_ptr__,Image16Bit *in)

{
  ImageTemplate<unsigned_char> IStack_48;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&IStack_48,0,0,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,&IStack_48,in->_width,in->_height,in->_colorCount,'\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_48);
  ConvertTo8Bit(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height);
  return __return_storage_ptr__;
}

Assistant:

Image ConvertTo8Bit( const Image16Bit & in )
    {
        Image out = Image().generate( in.width(), in.height(), in.colorCount() );
        ConvertTo8Bit( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }